

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  char *pcVar2;
  allocator local_121;
  string local_120;
  string local_100;
  allocator local_d9;
  undefined1 local_d8 [8];
  string linkFlagsConfig;
  string local_b0;
  undefined1 local_90 [8];
  string extraFlags;
  allocator local_59;
  undefined1 local_58 [8];
  string linkRuleVar;
  string linkLanguage;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"CMAKE_",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::operator+=
            ((string *)local_58,(string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_58,"_CREATE_MACOSX_FRAMEWORK");
  std::__cxx11::string::string((string *)local_90);
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"LINK_FLAGS",
             (allocator *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
  pcVar2 = cmGeneratorTarget::GetProperty(this_00,&local_b0);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
            (pcVar1,local_90,pcVar2);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d8,"LINK_FLAGS_",&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  cmsys::SystemTools::UpperCase
            (&local_100,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::operator+=((string *)local_d8,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar2 = cmGeneratorTarget::GetProperty
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,(string *)local_d8);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
            (pcVar1,local_90,pcVar2);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS",&local_121);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar1,(string *)local_90,&local_120,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  WriteLibraryRules(this,(string *)local_58,(string *)local_90,relink);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_MACOSX_FRAMEWORK";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags(
    extraFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags(
    extraFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->ConfigName);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}